

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O1

ShaderCreateInfo * __thiscall
Diligent::SerializedPipelineStateImpl::GetPatchedShaderCreateInfo
          (ShaderCreateInfo *__return_storage_ptr__,SerializedPipelineStateImpl *this,
          ARCHIVE_DEVICE_DATA_FLAGS DeviceType,Uint32 ShaderIndex)

{
  long lVar1;
  DeviceType DVar2;
  ulong uVar3;
  ulong uVar4;
  char (*in_R8) [73];
  string msg;
  Serializer<(Diligent::SerializerMode)0> Ser_1;
  Uint32 local_6c;
  undefined1 local_68 [32];
  Serializer<(Diligent::SerializerMode)0> local_48;
  
  local_6c = ShaderIndex;
  if ((this->m_Status)._M_i != PIPELINE_STATE_STATUS_READY) {
    FormatString<char[17],char_const*,char[68]>
              ((string *)local_68,(Diligent *)"Pipeline state \'",(char (*) [17])&this->m_Desc,
               (char **)"\' is not ready. Use GetStatus() to check the pipeline state status.",
               (char (*) [68])in_R8);
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1d7);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  if ((DeviceType ^ DeviceType - ARCHIVE_DEVICE_DATA_FLAG_D3D11) <=
      DeviceType - ARCHIVE_DEVICE_DATA_FLAG_D3D11) {
    FormatString<char[41]>
              ((string *)local_68,(char (*) [41])"Only single device data flag is expected");
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1d8);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  __return_storage_ptr__->Source = (Char *)0x0;
  __return_storage_ptr__->ByteCode = (void *)0x0;
  __return_storage_ptr__->FilePath = (Char *)0x0;
  __return_storage_ptr__->pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)0x0;
  (__return_storage_ptr__->field_4).SourceLength = 0;
  __return_storage_ptr__->EntryPoint = "main";
  (__return_storage_ptr__->Macros).Elements = (ShaderMacro *)0x0;
  (__return_storage_ptr__->Macros).Count = 0;
  (__return_storage_ptr__->Desc).super_DeviceObjectAttribs.Name = (Char *)0x0;
  (__return_storage_ptr__->Desc).ShaderType = SHADER_TYPE_UNKNOWN;
  (__return_storage_ptr__->Desc).UseCombinedTextureSamplers = false;
  (__return_storage_ptr__->Desc).CombinedSamplerSuffix = "_sampler";
  __return_storage_ptr__->SourceLanguage = SHADER_SOURCE_LANGUAGE_DEFAULT;
  __return_storage_ptr__->ShaderCompiler = SHADER_COMPILER_DEFAULT;
  (__return_storage_ptr__->HLSLVersion).Major = 0;
  (__return_storage_ptr__->HLSLVersion).Minor = 0;
  (__return_storage_ptr__->GLSLVersion).Major = 0;
  (__return_storage_ptr__->GLSLVersion).Minor = 0;
  (__return_storage_ptr__->GLESSLVersion).Major = 0;
  (__return_storage_ptr__->GLESSLVersion).Minor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->GLESSLVersion).Minor + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->MSLVersion).Minor + 1) = 0;
  __return_storage_ptr__->GLSLExtensions = (char *)0x0;
  __return_storage_ptr__->WebGPUEmulatedArrayIndexSuffix = (char *)0x0;
  DVar2 = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
  uVar3 = (ulong)local_6c;
  lVar1 = (long)(this->m_Data).Shaders._M_elems[DVar2].
                super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->m_Data).Shaders._M_elems[DVar2].
                 super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish - lVar1 >> 4) * -0x5555555555555555;
  if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
    FormatString<char[15],unsigned_int,char[73]>
              ((string *)local_68,(Diligent *)"Shader index (",(char (*) [15])&local_6c,
               (uint *)") is out of range. Call GetPatchedShaderCount() to get the shader count.",
               in_R8);
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1ed);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  else {
    local_68._0_8_ = *(long *)(lVar1 + 8 + uVar3 * 0x30);
    local_68._8_8_ = local_68._0_8_ + *(long *)(lVar1 + 0x10 + uVar3 * 0x30);
    local_68._16_8_ = local_68._0_8_;
    ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
              ((Serializer<(Diligent::SerializerMode)0> *)local_68,__return_storage_ptr__);
    if ((DVar2 & ~Direct3D11) == Metal_MacOS) {
      SerializedData::SerializedData
                ((SerializedData *)local_68,__return_storage_ptr__->ByteCode,
                 (__return_storage_ptr__->field_4).SourceLength);
      local_48.m_Start = (TPointer)local_68._8_8_;
      local_48.m_End = (TPointer)(local_68._8_8_ + local_68._16_8_);
      local_48.m_Ptr = (TPointer)local_68._8_8_;
      SerializedData::~SerializedData((SerializedData *)local_68);
      Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                (&local_48,&__return_storage_ptr__->ByteCode,
                 &(__return_storage_ptr__->field_4).SourceLength,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCreateInfo DILIGENT_CALL_TYPE SerializedPipelineStateImpl::GetPatchedShaderCreateInfo(
    ARCHIVE_DEVICE_DATA_FLAGS DeviceType,
    Uint32                    ShaderIndex) const
{
    DEV_CHECK_ERR(m_Status.load() == PIPELINE_STATE_STATUS_READY, "Pipeline state '", m_Desc.Name, "' is not ready. Use GetStatus() to check the pipeline state status.");
    DEV_CHECK_ERR(IsPowerOfTwo(DeviceType), "Only single device data flag is expected");

    ShaderCreateInfo ShaderCI;

    const auto  Type    = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
    const auto& Shaders = m_Data.Shaders[static_cast<size_t>(Type)];
    if (ShaderIndex < Shaders.size())
    {
        {
            Serializer<SerializerMode::Read> Ser{Shaders[ShaderIndex].Data};
            ShaderSerializer<SerializerMode::Read>::SerializeCI(Ser, ShaderCI);
        }
        if (Type == DeviceType::Metal_MacOS || Type == DeviceType::Metal_iOS)
        {
            // See DeviceObjectArchiveMtlImpl::UnpackShader and ShaderMtlSerializer<>::SerializeSource
            Serializer<SerializerMode::Read> Ser{SerializedData{const_cast<void*>(ShaderCI.ByteCode), ShaderCI.ByteCodeSize}};
            Ser.SerializeBytes(ShaderCI.ByteCode, ShaderCI.ByteCodeSize);
        }
    }
    else
    {
        DEV_ERROR("Shader index (", ShaderIndex, ") is out of range. Call GetPatchedShaderCount() to get the shader count.");
    }

    return ShaderCI;
}